

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILS.h
# Opt level: O1

double __thiscall
imrt::ILS::beamTargetedSearch(ILS *this,Plan *current_plan,int max_time,int max_iterations)

{
  double dVar1;
  undefined1 uVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  clock_t cVar7;
  Plan *this_00;
  ostream *poVar8;
  bool bVar9;
  bool bVar10;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Da;
  float fVar12;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  uint local_9c;
  double local_90;
  double local_70;
  undefined1 local_68 [8];
  long local_60;
  int local_58;
  double local_50;
  undefined4 local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"## Staring ILS search.",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  cVar7 = clock();
  this->time_begin = cVar7;
  this_00 = (Plan *)operator_new(0xd0);
  Plan::Plan(this_00,current_plan);
  local_90 = Plan::eval(current_plan);
  uVar11 = SUB84(local_90,0);
  uVar13 = (undefined4)((ulong)local_90 >> 0x20);
  local_50 = (double)max_time;
  local_70 = 0.0;
  bVar10 = true;
  uVar6 = 0;
  local_9c = 1;
  do {
    dVar1 = (double)CONCAT44(uVar13,uVar11);
    (*this->_vptr_ILS[6])(local_68,this,current_plan);
    uVar2 = local_68[0];
    lVar3 = local_60;
    iVar5 = local_58;
    while (iVar5 < 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"NOTE: No beamlet available.",0x1b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      (*this->_vptr_ILS[8])(this,current_plan);
      dVar1 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      (*this->_vptr_ILS[6])(local_68,this,current_plan);
      iVar5 = local_58;
      lVar3 = local_60;
      uVar2 = local_68[0];
      if (dVar1 < local_90) {
        Plan::newCopy(this_00,current_plan);
        local_90 = dVar1;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Iteration: ",0xb);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_9c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", eval: ",8);
    poVar8 = (ostream *)
             std::ostream::operator<<((ostream *)poVar8,EvaluationFunction::n_evaluations);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", time: ",8);
    fVar12 = roundf((float)(local_70 * 1000.0));
    poVar8 = std::ostream::_M_insert<double>((double)(fVar12 / 1000.0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", best: ",8);
    poVar8 = std::ostream::_M_insert<double>(local_90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", current: ",0xb);
    poVar8 = std::ostream::_M_insert<double>(dVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", beamlet: ",0xb);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", station: ",0xb);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,*(int *)(lVar3 + 8));
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", +-: ",6);
    std::ostream::_M_insert<bool>(SUB81(poVar8,0));
    local_48 = CONCAT31(local_48._1_3_,uVar2);
    (*this->_vptr_ILS[2])(this,current_plan);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    if ((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) < local_90) {
      Plan::newCopy(this_00,current_plan);
      local_90 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
    }
    uVar11 = extraout_XMM0_Da_00;
    uVar13 = extraout_XMM0_Db_00;
    uVar4 = 0;
    if (dVar1 < (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) ||
        dVar1 == (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00)) {
      if ((((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) == dVar1) &&
          (!NAN((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00)) && !NAN(dVar1))) ||
         (iVar5 = (*this->_vptr_ILS[5])(extraout_XMM0_Da_00,dVar1,this), (char)iVar5 == '\0')) {
        (*this->_vptr_ILS[10])(this,current_plan);
        uVar11 = SUB84(dVar1,0);
        uVar13 = (undefined4)((ulong)dVar1 >> 0x20);
        uVar4 = uVar6 + 1;
      }
    }
    uVar6 = uVar4;
    if (this->acceptance == 1) {
      (*this->_vptr_ILS[0xb])(this);
    }
    local_9c = local_9c + 1;
    cVar7 = clock();
    local_70 = (double)(cVar7 - this->time_begin) / 1000000.0;
    bVar9 = false;
    if (local_70 < local_50) {
      bVar9 = bVar10;
    }
    if (max_time == 0) {
      bVar9 = bVar10;
    }
    bVar10 = false;
    if ((int)local_9c < max_iterations) {
      bVar10 = bVar9;
    }
    if (max_iterations == 0) {
      bVar10 = bVar9;
    }
    iVar5 = (*this->_vptr_ILS[9])(this,(ulong)uVar6,(ulong)local_9c);
    if ((char)iVar5 != '\0') {
      (*this->_vptr_ILS[8])(this,current_plan);
      uVar6 = (int)uVar6 / 2;
      uVar11 = extraout_XMM0_Da_01;
      uVar13 = extraout_XMM0_Db_01;
    }
  } while (bVar10);
  Plan::newCopy(current_plan,this_00);
  dVar1 = Plan::getEvaluation(current_plan);
  EvaluationFunction::generate_voxel_dose_functions(this_00->ev);
  return dVar1;
}

Assistant:

double beamTargetedSearch (Plan& current_plan, int max_time, int max_iterations) {

    cout << "## Staring ILS search." << endl;

    //Start time
    std::clock_t time_end;
    time_begin=clock();

    //Best plan found so far
    Plan& best_plan= *new Plan(current_plan);

    pair<bool, pair<Station*, int>> target_beam;
    double local_eval, aux_eval,  best_eval=current_plan.eval();
    double used_time=0;
    // flag is used for the termination criterion
    bool flag = true;
    int no_improvement, iteration=1, perturbation_iteration=0;
    no_improvement = 0;

    local_eval=best_eval;
    
    while (flag) {
      // Get the targeted beamlet for local search
      target_beam = getLSBeamlet(current_plan);
      while (target_beam.second.second < 0) {
        // If there is no beamlet available perturbate
        // until we get one
        cout << "NOTE: No beamlet available." << endl;
        local_eval = perturbation(current_plan);
        perturbation_iteration = iteration;
        target_beam = getLSBeamlet(current_plan);
        if (local_eval < best_eval) {
          best_eval=local_eval;
          best_plan.newCopy(current_plan);
        }
      }

      cout << "Iteration: " << iteration << 
              ", eval: " << 
              EvaluationFunction::n_evaluations << 
              ", time: " << 
              (roundf(used_time * 1000) / 1000)  << 
              ", best: " << best_eval <<
              ", current: " << local_eval  << 
              ", beamlet: " << target_beam.second.second  <<
              ", station: " << target_beam.second.first->getAngle() << 
              ", +-: " << target_beam.first;

      // Apply local search on the targeted beamlet
      aux_eval = localSearch (target_beam, current_plan);
      cout << endl;

      // Check if there is a new global best solution 
      if (aux_eval < best_eval) {
        best_eval=aux_eval;
        best_plan.newCopy(current_plan);
      }

      // Acceptance criterion
      if (aux_eval < local_eval) {
        // Accept improving solution
        local_eval = aux_eval;
        no_improvement = 0;
      } else if (aux_eval!= local_eval && acceptanceCriterion(aux_eval, local_eval)) {
        // Accept non-improving solution
        local_eval = aux_eval;
        no_improvement = 0;
      } else {
        // Not accept solution
        undoLast(current_plan);
        no_improvement ++;
      }

      // Update SA temperature
      if (acceptance==ACCEPT_SA)
         updateTemperature();

      iteration++;

      // Termination criterion
      time_end=clock();
      used_time=double(time_end- time_begin) / CLOCKS_PER_SEC;
      if (max_time!=0 && used_time >= max_time) flag = false;
      if (max_iterations!=0 && iteration>=max_iterations) flag = false;

      // Check if we should perturbate
      if ( perturbate(no_improvement, iteration )) {
        local_eval = perturbation(current_plan);
        perturbation_iteration = iteration;
        no_improvement=no_improvement/2;
      }
    }

    current_plan.newCopy(best_plan);
    aux_eval=current_plan.getEvaluation();
    best_plan.getEvaluationFunction()->generate_voxel_dose_functions();
    return(aux_eval);
  }